

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.c
# Opt level: O1

pnm_t * pnm_create_from_file(char *path)

{
  char *pcVar1;
  bool bVar2;
  FILE *__stream;
  pnm_t *__ptr;
  char *pcVar3;
  uint8_t *__ptr_00;
  size_t sVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  int params [3];
  char tmp [1024];
  int local_444 [3];
  char local_438;
  char local_437;
  char local_436 [1030];
  ulong __size;
  
  __stream = fopen(path,"rb");
  iVar8 = 0;
  if (__stream == (FILE *)0x0) {
    return (pnm_t *)0x0;
  }
  __ptr = (pnm_t *)calloc(1,0x20);
  __ptr->format = -1;
  iVar9 = __ptr->format;
  do {
    if ((iVar8 == 2) && (iVar9 == 4)) break;
    do {
      pcVar3 = fgets(&local_438,0x400,__stream);
      if (pcVar3 == (char *)0x0) goto LAB_00401af9;
    } while (local_438 == '#');
    pcVar3 = &local_438;
    if (local_438 == 'P' && iVar9 == -1) {
      iVar9 = local_437 + -0x30;
      __ptr->format = iVar9;
      pcVar3 = local_436;
      if (2 < (int)local_437 - 0x34U) {
        __assert_fail("pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x3c,"pnm_t *pnm_create_from_file(const char *)");
      }
    }
    lVar5 = (long)iVar8;
    if (iVar8 < 3) {
      iVar8 = 2;
    }
    iVar8 = iVar8 + 1;
    do {
      if (*pcVar3 == '\0') {
LAB_00401a25:
        iVar8 = (int)lVar5;
        break;
      }
      pcVar3 = pcVar3 + -1;
      do {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      } while (*pcVar1 == ' ');
      if ((byte)(*pcVar1 - 0x3aU) < 0xf6) goto LAB_00401a25;
      cVar7 = *pcVar3;
      iVar6 = 0;
      if ((byte)(cVar7 - 0x30U) < 10) {
        iVar6 = 0;
        do {
          iVar6 = (int)cVar7 + iVar6 * 10 + -0x30;
          cVar7 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
        } while ((byte)(cVar7 - 0x30U) < 10);
      }
      local_444[lVar5] = iVar6;
      pcVar3 = pcVar3 + 1;
      bVar2 = lVar5 < 2;
      lVar5 = lVar5 + 1;
    } while (bVar2);
  } while (iVar8 < 3);
  __ptr->width = local_444[0];
  __ptr->height = local_444[1];
  __ptr->max = local_444[2];
  iVar8 = __ptr->format;
  if (iVar8 == 6) {
    iVar8 = local_444[0];
    iVar9 = 3;
    if (local_444[2] != 0xff) {
      if (local_444[2] != 0xffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x7e,"pnm_t *pnm_create_from_file(const char *)");
      }
      iVar8 = 6;
      iVar9 = local_444[0];
    }
    local_444[1] = local_444[1] * iVar9;
LAB_00401ab3:
    uVar10 = local_444[1] * iVar8;
    __ptr->buflen = uVar10;
  }
  else {
    if (iVar8 != 5) {
      if (iVar8 != 4) goto LAB_00401af9;
      iVar8 = local_444[0] + 0xe;
      if (-1 < local_444[0] + 7) {
        iVar8 = local_444[0] + 7;
      }
      __ptr->max = 1;
      iVar8 = iVar8 >> 3;
      goto LAB_00401ab3;
    }
    if (local_444[2] == 0xffff) {
      uVar10 = local_444[1] * local_444[0] * 2;
    }
    else {
      if (local_444[2] != 0xff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x6d,"pnm_t *pnm_create_from_file(const char *)");
      }
      uVar10 = local_444[1] * local_444[0];
    }
    __ptr->buflen = uVar10;
  }
  __size = (ulong)uVar10;
  __ptr_00 = (uint8_t *)malloc(__size);
  __ptr->buf = __ptr_00;
  sVar4 = fread(__ptr_00,1,__size,__stream);
  if (sVar4 == __size) {
    fclose(__stream);
    return __ptr;
  }
LAB_00401af9:
  fclose(__stream);
  if (__ptr != (pnm_t *)0x0) {
    free(__ptr->buf);
    free(__ptr);
  }
  return (pnm_t *)0x0;
}

Assistant:

pnm_t *pnm_create_from_file(const char *path)
{
    FILE *f = fopen(path, "rb");
    if (f == NULL)
        return NULL;

    pnm_t *pnm = calloc(1, sizeof(pnm_t));
    pnm->format = -1;

    char tmp[1024];
    int nparams = 0; // will be 3 when we're all done.
    int params[3];

    while (nparams < 3 && !(pnm->format == PNM_FORMAT_BINARY && nparams == 2)) {
        if (fgets(tmp, sizeof(tmp), f) == NULL)
            goto error;

        // skip comments
        if (tmp[0]=='#')
            continue;

        char *p = tmp;

        if (pnm->format == -1 && tmp[0]=='P') {
            pnm->format = tmp[1]-'0';
            assert(pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY);
            p = &tmp[2];
        }

        // pull integers out of this line until there are no more.
        while (nparams < 3 && *p!=0) {
            while (*p==' ')
                p++;

            // encounter rubbish? (End of line?)
            if (*p < '0' || *p > '9')
                break;

            int acc = 0;
            while (*p >= '0' && *p <= '9') {
                acc = acc*10 + *p - '0';
                p++;
            }

            params[nparams++] = acc;
            p++;
        }
    }

    pnm->width = params[0];
    pnm->height = params[1];
    pnm->max = params[2];

    switch (pnm->format) {
        case PNM_FORMAT_BINARY: {
            // files in the wild sometimes simply don't set max
            pnm->max = 1;

            pnm->buflen = pnm->height * ((pnm->width + 7)  / 8);
            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_GRAY: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_RGB: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height * 3;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height * 3;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;
            fclose(f);
            return pnm;
        }
    }

error:
    fclose(f);

    if (pnm != NULL) {
        free(pnm->buf);
        free(pnm);
    }

    return NULL;
}